

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

string * __thiscall
pbrt::FindMatchingNamedSpectrum_abi_cxx11_
          (string *__return_storage_ptr__,pbrt *this,SpectrumHandle *s)

{
  string *psVar1;
  _Rb_tree_node_base *p_Var2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  Float FVar7;
  DispatchSplit<7> local_6d;
  undefined4 local_6c;
  float local_68;
  undefined4 local_64;
  string *local_60;
  _Rb_tree_node_base *local_58;
  ulong local_50;
  pbrt *local_48;
  ulong local_40;
  ulong local_38;
  
  p_Var2 = (_Rb_tree_node_base *)Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_._24_8_;
  local_60 = __return_storage_ptr__;
  local_48 = this;
  do {
    psVar1 = local_60;
    if (p_Var2 == (_Rb_tree_node_base *)
                  (Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_ + 8)) {
      (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
      return psVar1;
    }
    local_40 = *(ulong *)(p_Var2 + 2);
    local_38 = *(ulong *)local_48;
    uVar5 = local_40 >> 0x30;
    uVar3 = local_38 >> 0x30;
    lVar4 = 0;
    local_58 = p_Var2;
    do {
      local_6c = *(undefined4 *)((long)&DAT_00a207c0 + lVar4);
      local_50 = local_38;
      local_64 = local_6c;
      local_68 = DispatchSplit<7>::operator()(&local_6d,&local_6c,&local_50,uVar3);
      local_50 = local_40;
      local_6c = local_64;
      FVar7 = DispatchSplit<7>::operator()(&local_6d,&local_6c,&local_50,uVar5);
      psVar1 = local_60;
      if ((local_68 != FVar7) || (NAN(local_68) || NAN(FVar7))) break;
      bVar6 = lVar4 != 0x34;
      lVar4 = lVar4 + 4;
    } while (bVar6);
    if ((local_68 == FVar7) && (!NAN(local_68) && !NAN(FVar7))) {
      (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,*(long *)(local_58 + 1),
                 (long)&(local_58[1]._M_parent)->_M_color + *(long *)(local_58 + 1));
      return psVar1;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_58);
  } while( true );
}

Assistant:

std::string FindMatchingNamedSpectrum(SpectrumHandle s) {
    auto sampledLambdasMatch = [](SpectrumHandle a, SpectrumHandle b) {
        const Float wls[] = {306, 360.932007, 380, 402, 455, 503, 579,
                             610, 660,        692, 702, 760, 800, 860};
        for (Float lambda : wls)
            if (a(lambda) != b(lambda))
                return false;
        return true;
    };
    for (const auto &spd : Spectra::namedSpectra) {
        if (sampledLambdasMatch(s, spd.second))
            return spd.first;
    }
    return "";
}